

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O1

void __thiscall adios2::core::Attribute<unsigned_short>::~Attribute(Attribute<unsigned_short> *this)

{
  pointer puVar1;
  pointer pcVar2;
  
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__Attribute_0087b470;
  puVar1 = (this->m_DataArray).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__AttributeBase_0087b768;
  pcVar2 = (this->super_AttributeBase).m_Name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->super_AttributeBase).m_Name.field_2) {
    operator_delete(pcVar2);
    return;
  }
  return;
}

Assistant:

~Attribute() = default;